

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall
QAbstractItemView::currentChanged
          (QAbstractItemView *this,QModelIndex *current,QModelIndex *previous)

{
  int iVar1;
  long lVar2;
  QAbstractItemViewPrivate *this_00;
  Data *pDVar3;
  QAbstractItemModel *pQVar4;
  bool bVar5;
  int iVar6;
  ItemFlags IVar7;
  QEditorInfo *pQVar8;
  ulong uVar9;
  QWidget *pQVar10;
  long in_FS_OFFSET;
  QWidget *editor;
  QModelIndex local_58;
  QPersistentModelIndex persistentCurrent;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  persistentCurrent.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::QPersistentModelIndex(&persistentCurrent,current);
  bVar5 = QModelIndex::isValid(previous);
  if (bVar5) {
    local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)this_00->model + 0x148))(&local_58,this_00->model,previous);
    pQVar8 = QAbstractItemViewPrivate::editorForIndex(this_00,&local_58);
    pDVar3 = (pQVar8->widget).wp.d;
    if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
      pQVar10 = (QWidget *)0x0;
    }
    else {
      pQVar10 = (QWidget *)(pQVar8->widget).wp.value;
    }
    editor = pQVar10;
    if ((*(byte *)(*(long *)(this + 0x20) + 9) & 0x80) != 0) {
      update(this,previous);
    }
    if (pQVar10 != (QWidget *)0x0) {
      bVar5 = QHash<QWidget_*,_QHashDummyValue>::contains(&(this_00->persistent).q_hash,&editor);
      if (!bVar5) {
        iVar6 = current->r;
        iVar1 = previous->r;
        (**(code **)(*(long *)this + 0x298))(this,editor);
        (**(code **)(*(long *)this + 0x290))(this,editor,(iVar6 != iVar1) * '\x03');
      }
    }
  }
  local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,&persistentCurrent);
  uVar9 = (**(code **)(*(long *)this + 0x2e8))(this,&local_58,0);
  if ((uVar9 & 0x10) == 0) {
    QPersistentModelIndex::operator=(&this_00->currentSelectionStartIndex,&local_58);
  }
  if ((((-1 < local_58.r) && (-1 < (long)local_58._0_8_)) &&
      (local_58.m.ptr != (QAbstractItemModel *)0x0)) && ((this_00->autoScrollTimer).m_id == Invalid)
     ) {
    if ((*(byte *)(*(long *)(this + 0x20) + 9) & 0x80) == 0) {
      this_00->shouldScrollToCurrentOnShow = this_00->autoScroll;
    }
    else {
      if (this_00->autoScroll != false) {
        (**(code **)(*(long *)this + 0x1e8))(this,&local_58,0);
      }
      update(this,&local_58);
      (**(code **)(*(long *)this + 0x2e0))(this,&local_58,1,0);
      iVar1 = local_58.r;
      pQVar4 = this_00->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&editor,&this_00->root);
      iVar6 = (**(code **)(*(long *)pQVar4 + 0x78))(pQVar4,(QModelIndex *)&editor);
      if (iVar1 == iVar6 + -1) {
        QAbstractItemViewPrivate::fetchMore(this_00);
      }
    }
  }
  bVar5 = false;
  if (((-1 < local_58.r) && (bVar5 = false, -1 < (long)local_58._0_8_)) &&
     (local_58.m.ptr != (QAbstractItemModel *)0x0)) {
    IVar7 = QModelIndex::flags(&local_58);
    bVar5 = SUB41(((uint)IVar7.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
                         super_QFlagsStorage<Qt::ItemFlag>.i & 2) >> 1,0);
  }
  QWidget::setAttribute((QWidget *)this,WA_InputMethodEnabled,bVar5);
  QPersistentModelIndex::~QPersistentModelIndex(&persistentCurrent);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::currentChanged(const QModelIndex &current, const QModelIndex &previous)
{
    Q_D(QAbstractItemView);
    Q_ASSERT(d->model);

    QPersistentModelIndex persistentCurrent(current); // in case commitData() moves things around (QTBUG-127852)

    if (previous.isValid()) {
        QModelIndex buddy = d->model->buddy(previous);
        QWidget *editor = d->editorForIndex(buddy).widget.data();
        if (isVisible()) {
            update(previous);
        }
        if (editor && !d->persistent.contains(editor)) {
            const bool rowChanged = current.row() != previous.row();
            commitData(editor); // might invalidate previous, don't use after this line (QTBUG-127852)
            if (rowChanged)
                closeEditor(editor, QAbstractItemDelegate::SubmitModelCache);
            else
                closeEditor(editor, QAbstractItemDelegate::NoHint);
        }
    }

    const QModelIndex newCurrent = persistentCurrent;

    QItemSelectionModel::SelectionFlags command = selectionCommand(newCurrent, nullptr);
    if ((command & QItemSelectionModel::Current) == 0)
        d->currentSelectionStartIndex = newCurrent;

    if (newCurrent.isValid() && !d->autoScrollTimer.isActive()) {
        if (isVisible()) {
            if (d->autoScroll)
                scrollTo(newCurrent);
            update(newCurrent);
            edit(newCurrent, CurrentChanged, nullptr);
            if (newCurrent.row() == (d->model->rowCount(d->root) - 1))
                d->fetchMore();
        } else {
            d->shouldScrollToCurrentOnShow = d->autoScroll;
        }
    }
    setAttribute(Qt::WA_InputMethodEnabled, (newCurrent.isValid() && (newCurrent.flags() & Qt::ItemIsEditable)));
}